

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int gpioSetAlertFunc(uint gpio,gpioAlertFunc_t f)

{
  FILE *__stream;
  int iVar1;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: gpio=%d function=%08X\n",myTimeStamp::buf,"gpioSetAlertFunc",gpio,
            (ulong)f & 0xffffffff);
  }
  if (libInitialised == '\0') {
    iVar1 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSetAlertFunc_cold_1();
    }
  }
  else if (gpio < 0x20) {
    iVar1 = 0;
    intGpioSetAlertFunc(gpio,f,0,(void *)0x0);
  }
  else {
    iVar1 = -2;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSetAlertFunc_cold_2();
    }
  }
  return iVar1;
}

Assistant:

int gpioSetAlertFunc(unsigned gpio, gpioAlertFunc_t f)
{
   DBG(DBG_USER, "gpio=%d function=%08X", gpio, (uint32_t)f);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   intGpioSetAlertFunc(gpio, f, 0, NULL);

   return 0;
}